

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall mp::NLFeeder_Easy::PermuteVars(NLFeeder_Easy *this)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  int *piVar4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __seed;
  pair<int,_int> *ppVar5;
  _Bit_type *p_Var6;
  pointer ppVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int local_5c;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::pair<int,_int>_>
  local_48;
  
  pdVar2 = (this->nlme_).vars_.lower_;
  pdVar3 = (this->nlme_).vars_.upper_;
  piVar4 = (this->nlme_).vars_.type_;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (&this->var_perm_,(long)(this->nlme_).vars_.num_col_);
  __seed._M_current =
       (this->var_perm_).
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppVar5 = (this->var_perm_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (long)ppVar5 - (long)__seed._M_current >> 3;
  if (ppVar5 != __seed._M_current) {
    p_Var6 = (this->nlv_obj_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_5c = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars;
    iVar13 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars;
    iVar14 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs;
    uVar15 = uVar10;
    do {
      uVar11 = uVar15 - 1;
      uVar15 = uVar15 + 0x3e;
      if (-1 < (long)uVar11) {
        uVar15 = uVar11;
      }
      uVar15 = 1L << ((byte)uVar11 & 0x3f) &
               p_Var6[((long)uVar15 >> 6) +
                      (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff];
      uVar8 = (uint)(uVar15 != 0) * -2;
      __seed._M_current[uVar11].first = uVar8;
      __seed._M_current[uVar11].second = (int)uVar11;
      if ((piVar4 != (int *)0x0) && (piVar4[uVar11] != 0)) {
        __seed._M_current[uVar11].first = uVar8 | 1;
        if (uVar15 == 0) {
          dVar1 = pdVar2[uVar11];
          if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar1 = pdVar3[uVar11], dVar1 != 1.0)) ||
             (NAN(dVar1))) {
            __seed._M_current[uVar11].first = uVar8 + 2;
            iVar13 = iVar13 + 1;
            (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_integer_vars =
                 iVar13;
          }
          else {
            local_5c = local_5c + 1;
            (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars =
                 local_5c;
          }
        }
        else {
          iVar14 = iVar14 + 1;
          (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_nl_integer_vars_in_objs =
               iVar14;
        }
      }
      uVar15 = uVar11;
    } while (uVar11 != 0);
  }
  if (__seed._M_current != ppVar5) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::pair<int,_int>_>
    ::_Temporary_buffer(&local_48,__seed,(long)((uVar10 - ((long)(uVar10 + 1) >> 0x3f)) + 1) >> 1);
    if (local_48._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (__seed._M_current,ppVar5);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (__seed._M_current,ppVar5,local_48._M_buffer,local_48._M_len);
    }
    operator_delete(local_48._M_buffer,local_48._M_len << 3);
  }
  ppVar7 = (this->var_perm_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(this->var_perm_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppVar7;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    do {
      lVar9 = lVar12 + -1;
      lVar12 = lVar12 + -1;
      ppVar7[ppVar7[lVar9].second].first = (int)lVar12;
    } while (lVar12 != 0);
  }
  return;
}

Assistant:

void PermuteVars() {
    auto vars = NLME().ColData();
    var_perm_.resize(NLME().NumCols());
    assert(nlv_obj_.size());               // was filled
    for (auto i=var_perm_.size(); i--; ) {
      var_perm_[i] = {-2*(int)nlv_obj_[i], i};  // Prioritize nonlinear
      if (vars.type_ && vars.type_[i]) {        // int var
        ++var_perm_[i].first;
        if (nlv_obj_[i])
          ++header_.num_nl_integer_vars_in_objs; // STATS
        else {
          if (0.0!=std::fabs(vars.lower_[i]) || 1.0!=vars.upper_[i]) {
            ++var_perm_[i].first;           // For linear, first binary
            ++header_.num_linear_integer_vars;   // STATS
          } else
            ++header_.num_linear_binary_vars;    // STATS
        }
      }
    }
    // Could just shove apart in linear time @todo
    std::stable_sort(var_perm_.begin(), var_perm_.end());
    // Create reverse mapping
    for (auto i=var_perm_.size(); i--; )
      var_perm_[var_perm_[i].second].first = i;
  }